

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<int,1>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  value_type_conflict5 *pvVar4;
  pointer ppVar5;
  reference pvVar6;
  size_t sVar7;
  PointAttribute *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<array<unsigned_int,_1UL>,_IndexType<unsigned_int,_AttributeValueIndex_tag_type_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var8;
  PointIndex i_2;
  uint32_t i_1;
  iterator it;
  AttributeValueIndex att_pos;
  AttributeValueIndex i;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  AttributeHashableValue hashable_value;
  AttributeValue att_value;
  unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  value_to_index_map;
  AttributeValueIndex unique_vals;
  PointAttribute *in_stack_fffffffffffffea8;
  PointAttribute *in_stack_fffffffffffffeb0;
  pair<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  *in_stack_fffffffffffffeb8;
  unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  *in_stack_fffffffffffffec0;
  GeometryAttribute *in_stack_fffffffffffffed8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  *in_stack_fffffffffffffee0;
  uint local_e0;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_dc;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_d8;
  uint local_d4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_d0;
  uint local_cc;
  undefined4 local_c8;
  uint local_c4;
  _Node_iterator_base<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_c0;
  undefined1 local_b8;
  pair<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  local_b0;
  _Node_iterator_base<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_a0;
  uint local_94;
  _Type local_90;
  uint local_8c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_88 [10];
  array<unsigned_int,_1UL> local_60;
  _Type local_5c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_1c [6];
  uint local_4;
  
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_1c,0);
  std::
  unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::unordered_map((unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                   *)0x1ea2a7);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::IndexTypeVector(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_88,0);
  while (bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                           (local_88,&in_RDI->num_unique_entries_), bVar1) {
    local_94 = (uint)IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator+
                               ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                in_stack_fffffffffffffea8,
                                (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                0x1ea307);
    local_8c = local_94;
    local_90[0] = (int)GeometryAttribute::GetValue<int,1>
                                 (in_stack_fffffffffffffed8,
                                  (AttributeValueIndex)(uint)in_stack_fffffffffffffee0);
    local_5c[0] = local_90[0];
    pvVar3 = std::array<unsigned_int,_1UL>::operator[]
                       ((array<unsigned_int,_1UL> *)in_stack_fffffffffffffeb0,
                        (size_type)in_stack_fffffffffffffea8);
    pvVar4 = (value_type_conflict5 *)
             std::array<int,_1UL>::operator[]
                       ((array<int,_1UL> *)in_stack_fffffffffffffeb0,
                        (size_type)in_stack_fffffffffffffea8);
    *pvVar3 = *pvVar4;
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
         ::find((unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                 *)in_stack_fffffffffffffea8,(key_type *)0x1ea3a9);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
         ::end((unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                *)in_stack_fffffffffffffea8);
    bVar1 = std::__detail::operator!=(&local_a0,&local_a8);
    if (bVar1) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                             *)0x1ea3fd);
      in_stack_fffffffffffffed8 = (GeometryAttribute *)&ppVar5->second;
      in_stack_fffffffffffffee0 =
           (IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
            *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
              ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                            *)in_stack_fffffffffffffeb0,
                           (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                           in_stack_fffffffffffffea8);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 in_stack_fffffffffffffee0,(ThisIndexType *)in_stack_fffffffffffffed8);
    }
    else {
      std::
      pair<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
      ::
      pair<std::array<unsigned_int,_1UL>_&,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_&,_true>
                (&local_b0,&local_60,local_1c);
      _Var8 = std::
              unordered_map<std::array<unsigned_int,1ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,draco::HashArray<std::array<unsigned_int,1ul>>,std::equal_to<std::array<unsigned_int,1ul>>,std::allocator<std::pair<std::array<unsigned_int,1ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>>
              ::
              insert<std::pair<std::array<unsigned_int,1ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      local_c0._M_cur =
           (__node_type *)
           _Var8.first.
           super__Node_iterator_base<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
           ._M_cur;
      local_b8 = _Var8.second;
      local_c4 = local_1c[0].value_;
      GeometryAttribute::SetAttributeValue
                (in_stack_fffffffffffffed8,
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                 local_c0._M_cur);
      in_stack_fffffffffffffec0 =
           (unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
            *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
              ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                            *)in_stack_fffffffffffffeb0,
                           (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                           in_stack_fffffffffffffea8);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 in_stack_fffffffffffffec0,local_1c);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_1c);
    }
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_88);
  }
  bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator==
                    (local_1c,&in_RDI->num_unique_entries_);
  if (bVar1) {
    local_4 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
  }
  else {
    bVar1 = is_mapping_identity(in_RDI);
    if (bVar1) {
      SetExplicitMapping(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      for (local_cc = 0; local_cc < in_RDI->num_unique_entries_; local_cc = local_cc + 1) {
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_d0,local_cc);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_d8,local_cc)
        ;
        pvVar6 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                 ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                               *)in_stack_fffffffffffffeb0,
                              (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                              in_stack_fffffffffffffea8);
        local_d4 = pvVar6->value_;
        SetPointMapEntry(in_stack_fffffffffffffea8,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffeb0);
      }
    }
    else {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_dc,0);
      while( true ) {
        sVar7 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                        *)0x1ea673);
        local_e0 = (uint)sVar7;
        bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<(&local_dc,&local_e0)
        ;
        if (!bVar1) break;
        in_stack_fffffffffffffeb0 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffeb0,
                          (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                          in_stack_fffffffffffffea8);
        in_stack_fffffffffffffea8 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffeb0,
                          (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                          in_stack_fffffffffffffea8);
        SetPointMapEntry(in_stack_fffffffffffffea8,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffeb0);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_dc);
      }
    }
    uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
    in_RDI->num_unique_entries_ = uVar2;
    local_4 = in_RDI->num_unique_entries_;
  }
  local_c8 = 1;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                      *)0x1ea730);
  std::
  unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::~unordered_map((unordered_map<std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_1UL>_>,_std::equal_to<std::array<unsigned_int,_1UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_1UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                    *)0x1ea73d);
  return local_4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  // Hash map storing index of the first attribute with a given value.
  unordered_map<AttributeHashableValue, AttributeValueIndex,
                HashArray<AttributeHashableValue>>
      value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    // Check if the given attribute value has been used before already.
    auto it = value_to_index_map.find(hashable_value);
    if (it != value_to_index_map.end()) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      // Update the hash map with a new entry pointing to the latest unique
      // vertex index.
      value_to_index_map.insert(
          std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                                 unique_vals));
      // Add the unique value to the mesh builder.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}